

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
 __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
::handle_value<unsigned_long&>
          (json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
           *this,unsigned_long *v,bool skip_callback)

{
  value_t vVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  json_value jVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar9;
  pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
  pVar10;
  undefined1 local_61;
  undefined1 local_60 [8];
  json_value local_58;
  undefined4 local_4c;
  undefined1 local_48 [8];
  json_value local_40;
  undefined1 local_38 [8];
  json_value local_30;
  
  uVar2 = *(uint *)(this + 0x38);
  if (uVar2 == 0 && *(long *)(this + 0x20) == *(long *)(this + 0x30)) {
    __assert_fail("not keep_stack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0xfdb,
                  "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = unsigned long &]"
                 );
  }
  uVar8 = (ulong)uVar2 - 1;
  uVar7 = (ulong)uVar2 + 0x3e;
  if (-1 < (long)uVar8) {
    uVar7 = uVar8;
  }
  if ((*(ulong *)(*(long *)(this + 0x30) + ((long)uVar7 >> 6) * 8 + -8 +
                 (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar8 & 0x3f) &
      1) == 0) {
    uVar8 = 0;
    pbVar9 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
    goto LAB_001aad80;
  }
  local_58.number_unsigned = *v;
  local_60[0] = number_unsigned;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_60);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_60);
  if (skip_callback) {
LAB_001aab68:
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      local_38[0] = local_60[0];
      local_30.string = local_58.string;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_60);
      local_60[0] = null;
      local_58.object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_38);
      pbVar9 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)this;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_38);
      vVar1 = pbVar9->m_type;
      pbVar9->m_type = local_38[0];
      jVar5 = pbVar9->m_value;
      pbVar9->m_value = local_30;
      local_38[0] = vVar1;
      local_30 = jVar5;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pbVar9);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_38);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_38 + 8),local_38[0]);
      pbVar9 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)this;
    }
    else {
      pcVar3 = *(char **)(*(long *)(this + 0x10) + -8);
      if (pcVar3 == (char *)0x0) goto LAB_001aad5c;
      if (*pcVar3 == '\x01') {
        lVar4 = *(long *)(this + 0x58);
        uVar2 = *(uint *)(this + 0x60);
        if (uVar2 == 0 && *(long *)(this + 0x48) == lVar4) {
          __assert_fail("not key_keep_stack.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                        ,0x1001,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = unsigned long &]"
                       );
        }
        uVar8 = (ulong)uVar2 - 1;
        uVar7 = (ulong)uVar2 + 0x3e;
        if (-1 < (long)uVar8) {
          uVar7 = uVar8;
        }
        uVar7 = *(ulong *)(lVar4 + ((long)uVar7 >> 6) * 8 + -8 +
                          (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8);
        *(uint *)(this + 0x60) = uVar2 - 1;
        if (uVar2 == 0) {
          *(undefined4 *)(this + 0x60) = 0x3f;
          *(long *)(this + 0x58) = lVar4 + -8;
        }
        if ((1L << ((byte)uVar8 & 0x3f) & uVar7) == 0) goto LAB_001aad5c;
        if (*(long *)(this + 0x70) == 0) {
          __assert_fail("object_element",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                        ,0x1009,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = unsigned long &]"
                       );
        }
        local_48[0] = local_60[0];
        local_40.string = local_58.string;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_60);
        local_60[0] = null;
        local_58.object = (object_t *)0x0;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_48);
        pbVar9 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   **)(this + 0x70);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_48);
        vVar1 = pbVar9->m_type;
        pbVar9->m_type = local_48[0];
        jVar5 = pbVar9->m_value;
        pbVar9->m_value = local_40;
        local_48[0] = vVar1;
        local_40 = jVar5;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar9);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_48);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_48 + 8),local_48[0]);
        pbVar9 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   **)(this + 0x70);
      }
      else {
        if (*pcVar3 != '\x02') {
LAB_001aadb6:
          __assert_fail("ref_stack.back()->is_array() or ref_stack.back()->is_object()",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                        ,0xffa,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = unsigned long &]"
                       );
        }
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                     **)(pcVar3 + 8),
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_60);
        pbVar9 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + -8) + 8) + 8) + -0x10);
      }
    }
    uVar8 = CONCAT71((int7)((ulong)this >> 8),1);
  }
  else {
    local_4c = (undefined4)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3);
    local_61 = 5;
    if (*(long *)(this + 0x90) == 0) {
      std::__throw_bad_function_call();
      goto LAB_001aadb6;
    }
    cVar6 = (**(code **)(this + 0x98))(this + 0x80,&local_4c,&local_61,local_60);
    if (cVar6 != '\0') goto LAB_001aab68;
LAB_001aad5c:
    uVar8 = 0;
    pbVar9 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_60);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_60 + 8),local_60[0]);
LAB_001aad80:
  pVar10._0_8_ = uVar8 & 0xffffffff;
  pVar10.second = pbVar9;
  return pVar10;
}

Assistant:

std::pair<bool, BasicJsonType*> handle_value(Value&& v, const bool skip_callback = false) {
		assert(not keep_stack.empty());

		// do not handle this value if we know it would be added to a discarded
		// container
		if (not keep_stack.back()) {
			return {false, nullptr};
		}

		// create value
		auto value = BasicJsonType(std::forward<Value>(v));

		// check callback
		const bool keep = skip_callback or callback(static_cast<int>(ref_stack.size()), parse_event_t::value, value);

		// do not handle this value if we just learnt it shall be discarded
		if (not keep) {
			return {false, nullptr};
		}

		if (ref_stack.empty()) {
			root = std::move(value);
			return {true, &root};
		}

		// skip this value if we already decided to skip the parent
		// (https://github.com/nlohmann/json/issues/971#issuecomment-413678360)
		if (not ref_stack.back()) {
			return {false, nullptr};
		}

		// we now only expect arrays and objects
		assert(ref_stack.back()->is_array() or ref_stack.back()->is_object());

		if (ref_stack.back()->is_array()) {
			ref_stack.back()->m_value.array->push_back(std::move(value));
			return {true, &(ref_stack.back()->m_value.array->back())};
		} else {
			// check if we should store an element for the current key
			assert(not key_keep_stack.empty());
			const bool store_element = key_keep_stack.back();
			key_keep_stack.pop_back();

			if (not store_element) {
				return {false, nullptr};
			}

			assert(object_element);
			*object_element = std::move(value);
			return {true, object_element};
		}
	}